

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readthis.cpp
# Opt level: O0

bool __thiscall DReadThisMenu::MenuEvent(DReadThisMenu *this,int mkey,bool fromcontroller)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  float volume;
  FSoundID local_24;
  undefined1 local_1d;
  int local_1c;
  bool fromcontroller_local;
  DReadThisMenu *pDStack_18;
  int mkey_local;
  DReadThisMenu *this_local;
  
  local_1d = fromcontroller;
  local_1c = mkey;
  pDStack_18 = this;
  if (mkey == 6) {
    FSoundID::FSoundID(&local_24,"menu/choose");
    volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_24,volume,0.0);
    this->mScreen = this->mScreen + 1;
    this->mInfoTic = gametic;
    if (((::level.info != (level_info_t *)0x0) &&
        (sVar4 = FString::Len(&(::level.info)->F1Pic), sVar4 != 0)) ||
       (iVar1 = this->mScreen, uVar3 = TArray<FName,_FName>::Size(&gameinfo.infoPages),
       (int)uVar3 < iVar1)) {
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
    }
    return true;
  }
  bVar2 = DMenu::MenuEvent(&this->super_DMenu,mkey,fromcontroller);
  return bVar2;
}

Assistant:

bool DReadThisMenu::MenuEvent(int mkey, bool fromcontroller)
{
	if (mkey == MKEY_Enter)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
		mScreen++;
		mInfoTic = gametic;
		if ((level.info != NULL && level.info->F1Pic.Len() != 0) || mScreen > int(gameinfo.infoPages.Size()))
		{
			Close();
		}
		return true;
	}
	else return Super::MenuEvent(mkey, fromcontroller);
}